

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastStringCheck
          (Lowerer *this,Instr *instr,RegOpnd *srcReg1,RegOpnd *srcReg2,bool isEqual,bool isStrict,
          LabelInstr *labelHelper,LabelInstr *labelBranchSuccess,LabelInstr *labelBranchFail)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  BranchInstr *this_00;
  LabelInstr *pLVar5;
  IndirOpnd *pIVar6;
  IntConstOpnd *pIVar7;
  RegOpnd *pRVar8;
  RegOpnd *baseOpnd;
  RegOpnd *baseOpnd_00;
  RegOpnd *dst;
  HelperCallOpnd *src1Opnd;
  Instr *callInstr;
  RegOpnd *local_a8;
  Instr *instrCall;
  RegOpnd *dstOpnd;
  RegOpnd *src1FirstChar;
  RegOpnd *src2FlatString;
  RegOpnd *src1FlatString;
  RegOpnd *src1LengthOpnd;
  RegOpnd *otherOpnd;
  Instr *instrInsert;
  bool isStrict_local;
  bool isEqual_local;
  RegOpnd *srcReg2_local;
  RegOpnd *srcReg1_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if ((((((instr->m_opcode != BrSrEq_A) && (instr->m_opcode != BrSrNeq_A)) &&
        (instr->m_opcode != BrEq_A)) &&
       (((instr->m_opcode != BrNeq_A && (instr->m_opcode != BrSrNotEq_A)) &&
        ((instr->m_opcode != BrSrNotNeq_A &&
         ((instr->m_opcode != BrNotEq_A && (instr->m_opcode != BrNotNeq_A)))))))) &&
      (instr->m_opcode != CmEq_A)) &&
     (((instr->m_opcode != CmNeq_A && (instr->m_opcode != CmSrEq_A)) &&
      (instr->m_opcode != CmSrNeq_A)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5f33,
                       "(instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  GenerateStringTest(this,srcReg1,instr,labelHelper,(LabelInstr *)0x0,true);
  bVar2 = IR::Opnd::IsEqual(&srcReg1->super_Opnd,&srcReg2->super_Opnd);
  if (bVar2) {
    InsertBranch(Br,labelBranchSuccess,instr);
    bVar2 = IR::Instr::IsBranchInstr(instr);
    if (bVar2) {
      this_00 = IR::Instr::AsBranchInstr(instr);
      pLVar5 = IR::BranchInstr::GetTarget(this_00);
      pLVar5->field_0x78 = pLVar5->field_0x78 & 0xdf | 0x20;
    }
  }
  else {
    InsertCompareBranch(this,&srcReg1->super_Opnd,&srcReg2->super_Opnd,BrEq_A,labelBranchSuccess,
                        instr,false);
    if (isStrict) {
      GenerateStringTest(this,srcReg2,instr,labelBranchFail,(LabelInstr *)0x0,true);
      if (((*(uint *)&srcReg1->m_sym->field_0x18 >> 0xb & 1) != 0) ||
         ((*(uint *)&srcReg2->m_sym->field_0x18 >> 0xb & 1) != 0)) {
        local_a8 = srcReg1;
        if ((*(uint *)&srcReg1->m_sym->field_0x18 >> 0xb & 1) != 0) {
          local_a8 = srcReg2;
        }
        uVar3 = Js::JavascriptString::GetOffsetOfcharLength();
        pIVar6 = IR::IndirOpnd::New(local_a8,uVar3,TyUint32,this->m_func,false);
        pIVar7 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,true);
        InsertCompareBranch(this,&pIVar6->super_Opnd,&pIVar7->super_Opnd,BrNeq_A,labelBranchFail,
                            instr,false);
        return true;
      }
    }
    else {
      GenerateStringTest(this,srcReg2,instr,labelHelper,(LabelInstr *)0x0,true);
    }
    pRVar8 = IR::RegOpnd::New(TyUint32,this->m_func);
    uVar3 = Js::JavascriptString::GetOffsetOfcharLength();
    pIVar6 = IR::IndirOpnd::New(srcReg1,uVar3,TyUint32,this->m_func,false);
    InsertMove(&pRVar8->super_Opnd,&pIVar6->super_Opnd,instr,true);
    uVar3 = Js::JavascriptString::GetOffsetOfcharLength();
    pIVar6 = IR::IndirOpnd::New(srcReg2,uVar3,TyUint32,this->m_func,false);
    InsertCompareBranch(this,&pIVar6->super_Opnd,&pRVar8->super_Opnd,BrNeq_A,labelBranchFail,instr,
                        false);
    baseOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    uVar3 = Js::JavascriptString::GetOffsetOfpszValue();
    pIVar6 = IR::IndirOpnd::New(srcReg1,uVar3,TyUint64,this->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar6->super_Opnd,instr,true);
    pIVar7 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
    InsertCompareBranch(this,&baseOpnd->super_Opnd,&pIVar7->super_Opnd,BrEq_A,labelHelper,instr,
                        false);
    baseOpnd_00 = IR::RegOpnd::New(TyUint64,this->m_func);
    uVar3 = Js::JavascriptString::GetOffsetOfpszValue();
    pIVar6 = IR::IndirOpnd::New(srcReg2,uVar3,TyUint64,this->m_func,false);
    InsertMove(&baseOpnd_00->super_Opnd,&pIVar6->super_Opnd,instr,true);
    pIVar7 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
    InsertCompareBranch(this,&baseOpnd_00->super_Opnd,&pIVar7->super_Opnd,BrEq_A,labelHelper,instr,
                        false);
    dst = IR::RegOpnd::New(TyUint16,this->m_func);
    pIVar6 = IR::IndirOpnd::New(baseOpnd,0,TyUint16,this->m_func,false);
    InsertMove(&dst->super_Opnd,&pIVar6->super_Opnd,instr,true);
    pIVar6 = IR::IndirOpnd::New(baseOpnd_00,0,TyUint16,this->m_func,false);
    InsertCompareBranch(this,&pIVar6->super_Opnd,&dst->super_Opnd,BrNeq_A,labelBranchFail,instr,
                        false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar8->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&baseOpnd->super_Opnd);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&baseOpnd_00->super_Opnd);
    pRVar8 = IR::RegOpnd::New(TyInt32,this->m_func);
    src1Opnd = IR::HelperCallOpnd::New(HelperWMemCmp,this->m_func);
    callInstr = IR::Instr::New(Call,&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,callInstr);
    LowererMD::LowerCall(&this->m_lowererMD,callInstr,3);
    InsertTestBranch(&pRVar8->super_Opnd,&pRVar8->super_Opnd,BrEq_A,labelBranchSuccess,instr);
    InsertBranch(Br,labelBranchFail,instr);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastStringCheck(IR::Instr *instr, IR::RegOpnd *srcReg1, IR::RegOpnd *srcReg2, bool isEqual, bool isStrict, IR::LabelInstr *labelHelper, IR::LabelInstr *labelBranchSuccess, IR::LabelInstr *labelBranchFail)
{
    Assert(instr->m_opcode == Js::OpCode::BrSrEq_A ||
        instr->m_opcode == Js::OpCode::BrSrNeq_A ||
        instr->m_opcode == Js::OpCode::BrEq_A ||
        instr->m_opcode == Js::OpCode::BrNeq_A ||
        instr->m_opcode == Js::OpCode::BrSrNotEq_A ||
        instr->m_opcode == Js::OpCode::BrSrNotNeq_A ||
        instr->m_opcode == Js::OpCode::BrNotEq_A ||
        instr->m_opcode == Js::OpCode::BrNotNeq_A ||
        instr->m_opcode == Js::OpCode::CmEq_A ||
        instr->m_opcode == Js::OpCode::CmNeq_A ||
        instr->m_opcode == Js::OpCode::CmSrEq_A ||
        instr->m_opcode == Js::OpCode::CmSrNeq_A);

    // if src1 is not string
    // generate object test, if not equal jump to $helper
    // compare type check to string, if not jump to $helper
    //
    // if strict mode generate string test as above for src2 and jump to $failure if failed any time
    // else if not strict generate string test as above for src2 and jump to $helper if failed any time
    //
    // Compare length of src1 and src2 if not equal goto $failure
    //
    // if src1 is not flat string jump to $helper
    //
    // if src1 and src2 m_pszValue pointer match goto $success
    //
    // if src2 is not flat string jump to $helper
    //
    // if first character of src1 and src2 doesn't match goto $failure
    //
    // shift left by 1 length of src1 (length*2)
    //
    // wmemcmp src1 and src2 flat strings till length * 2
    //
    // test eax (result of wmemcmp)
    // if equal jump to $success else to $failure
    //
    // $success
    //     jmp to $fallthrough
    // $failure
    //     jmp to $fallthrough
    // $helper
    //
    // $fallthrough

    // Generates:
    //      GenerateObjectTest(src1);
    //      CMP srcReg1, srcReg2
    //      JEQ $success
    //      MOV s1, [srcReg1 + offset(Type)]
    //      CMP type, static_string_type
    //      JNE $helper
    //      GenerateObjectTest(src2);
    //      MOV s2, [srcReg2 + offset(Type)]
    //      CMP type, static_string_type
    //      JNE $fail                         ; if src1 is string but not src2, src1 !== src2 if isStrict
    //      MOV s3, [srcReg1,offset(m_charLength)]
    //      CMP [srcReg2,offset(m_charLength)], s3
    //      JNE $fail                     <--- length check done
    //      MOV s4, [srcReg1,offset(m_pszValue)]
    //      CMP s4, 0
    //      JEQ $helper
    //      MOV s5, [srcReg2,offset(m_pszValue)]
    //      CMP s5, 0
    //      JEQ $helper
    //      MOV s6,[s4]
    //      CMP [s5], s6                       -First character comparison
    //      JNE $fail
    //      SHL length, 1
    //      eax = wmemcmp(src1String, src2String, length*2)
    //      TEST eax, eax
    //      JEQ $success
    //      JMP $fail
    IR::Instr* instrInsert = instr;

    GenerateStringTest(srcReg1, instrInsert, labelHelper);

    if (srcReg1->IsEqual(srcReg2))
    {
        InsertBranch(Js::OpCode::Br, labelBranchSuccess, instrInsert);
#if DBG
        if (instr->IsBranchInstr())
        {
            // we might have other cases on helper path which will generate branch to the target
            instr->AsBranchInstr()->GetTarget()->m_noHelperAssert = true;
        }
#endif
        return true;
    }
    //      CMP srcReg1, srcReg2                       - Ptr comparison
    //      JEQ $branchSuccess
    InsertCompareBranch(srcReg1, srcReg2, Js::OpCode::BrEq_A, labelBranchSuccess, instrInsert);

    if (isStrict)
    {
        GenerateStringTest(srcReg2, instrInsert, labelBranchFail);
    }
    else
    {
        GenerateStringTest(srcReg2, instrInsert, labelHelper);
    }

    if (isStrict && (srcReg1->m_sym->m_isStrEmpty || srcReg2->m_sym->m_isStrEmpty))
    {
        IR::RegOpnd* otherOpnd = srcReg1->m_sym->m_isStrEmpty ? srcReg2 : srcReg1;
        InsertCompareBranch(IR::IndirOpnd::New(otherOpnd, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, m_func), IR::IntConstOpnd::New(0, TyUint32, this->m_func, true), Js::OpCode::BrNeq_A, labelBranchFail, instrInsert);
        return true;
    }

    //      MOV s3, [srcReg1,offset(m_charLength)]
    //      CMP [srcReg2,offset(m_charLength)], s3
    //      JNE $branchfail

    IR::RegOpnd * src1LengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(src1LengthOpnd, IR::IndirOpnd::New(srcReg1, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, m_func), instrInsert);
    InsertCompareBranch(IR::IndirOpnd::New(srcReg2, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, m_func), src1LengthOpnd, Js::OpCode::BrNeq_A, labelBranchFail, instrInsert);

    //      MOV s4, [src1,offset(m_pszValue)]
    //      CMP s4, 0
    //      JEQ $helper
    //      MOV s5, [src2,offset(m_pszValue)]
    //      CMP s5, 0
    //      JEQ $helper

    IR::RegOpnd * src1FlatString = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src1FlatString, IR::IndirOpnd::New(srcReg1, Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, m_func), instrInsert);
    InsertCompareBranch(src1FlatString, IR::IntConstOpnd::New(0, TyUint32, m_func), Js::OpCode::BrEq_A, labelHelper, instrInsert);

    IR::RegOpnd * src2FlatString = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src2FlatString, IR::IndirOpnd::New(srcReg2, Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, m_func), instrInsert);
    InsertCompareBranch(src2FlatString, IR::IntConstOpnd::New(0, TyUint32, m_func), Js::OpCode::BrEq_A, labelHelper, instrInsert);

    //      MOV s6,[s4]
    //      CMP [s5], s6                       -First character comparison
    //      JNE $branchfail

    IR::RegOpnd * src1FirstChar = IR::RegOpnd::New(TyUint16, m_func);
    InsertMove(src1FirstChar, IR::IndirOpnd::New(src1FlatString, 0, TyUint16, m_func), instrInsert);
    InsertCompareBranch(IR::IndirOpnd::New(src2FlatString, 0, TyUint16, m_func), src1FirstChar, Js::OpCode::BrNeq_A, labelBranchFail, instrInsert);

    // eax = wmemcmp(src1String, src2String, length)

    m_lowererMD.LoadHelperArgument(instr, src1LengthOpnd);
    m_lowererMD.LoadHelperArgument(instr, src1FlatString);
    m_lowererMD.LoadHelperArgument(instr, src2FlatString);
    IR::RegOpnd *dstOpnd = IR::RegOpnd::New(TyInt32, this->m_func);
    IR::Instr *instrCall = IR::Instr::New(Js::OpCode::Call, dstOpnd, IR::HelperCallOpnd::New(IR::HelperWMemCmp, m_func), m_func);
    instr->InsertBefore(instrCall);
    m_lowererMD.LowerCall(instrCall, 3);

    // TEST eax, eax
    // JEQ success
    InsertTestBranch(dstOpnd, dstOpnd, Js::OpCode::BrEq_A, labelBranchSuccess, instrInsert);
    // JMP fail
    InsertBranch(Js::OpCode::Br, labelBranchFail, instrInsert);

    return true;
}